

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::LDA_ID_X(CPU *this)

{
  byte bVar1;
  uint16_t address;
  
  this->cycles = 6;
  bVar1 = GetByte(this);
  address = ReadWord(this,(ushort)this->X + (ushort)bVar1);
  bVar1 = ReadByte(this,address);
  this->A = bVar1;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDA_ID_X()
{
    cycles = 6;
    A = ReadByte(ReadWord((uint16_t)(GetByte() + X)));
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}